

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirINCTRD(void)

{
  bool bVar1;
  int iVar2;
  fullpath_ref_t trd;
  char *message;
  aint length;
  aint offset;
  aint val;
  string filename;
  string local_30;
  
  offset = 0;
  length = 0x7fffffff;
  trd = GetInputFile(&lp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"",(allocator<char> *)&local_30);
  bVar1 = anyComma(&lp);
  if (bVar1) {
    bVar1 = anyComma(&lp);
    if (!bVar1) {
      GetDelimitedString_abi_cxx11_(&local_30,&lp);
      std::__cxx11::string::operator=((string *)&filename,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  if (filename._M_string_length == 0) {
LAB_0010ceeb:
    Error("[INCTRD] Syntax error",bp,IF_FIRST);
LAB_0010cf04:
    SkipToEol(&lp);
  }
  else {
    bVar1 = anyComma(&lp);
    if (bVar1) {
      bVar1 = anyComma(&lp);
      if (!bVar1) {
        iVar2 = ParseExpressionNoSyntaxError(&lp,&val);
        if (iVar2 == 0) goto LAB_0010ceeb;
        if (-1 < val) {
          offset = val;
          goto LAB_0010ce8d;
        }
        message = "[INCTRD] Negative offset value is not allowed";
LAB_0010cf32:
        ErrorInt(message,val,PASS3);
        goto LAB_0010cf04;
      }
      lp = lp + -1;
LAB_0010ce8d:
      bVar1 = anyComma(&lp);
      if (bVar1) {
        iVar2 = ParseExpressionNoSyntaxError(&lp,&val);
        if (iVar2 == 0) goto LAB_0010ceeb;
        if (val < 0) {
          message = "[INCTRD] Negative length value is not allowed";
          goto LAB_0010cf32;
        }
        length = val;
      }
    }
    iVar2 = TRD_PrepareIncFile(trd,filename._M_dataplus._M_p,&offset,&length);
    if (iVar2 != 0) {
      BinIncFile(trd,offset,length);
    }
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

static void dirINCTRD() {
	aint val, offset = 0, length = INT_MAX;
	fullpath_ref_t trdfile = GetInputFile(lp);
	std::string filename {""};
	if (anyComma(lp) && !anyComma(lp)) filename = GetDelimitedString(lp);
	if (filename.empty()) {
		// file-in-disk syntax error
		Error("[INCTRD] Syntax error", bp, IF_FIRST);
		SkipToEol(lp);
		return;
	}
	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCTRD] Syntax error", bp, IF_FIRST);
				SkipToEol(lp);
				return;
			}
			if (val < 0) {
				ErrorInt("[INCTRD] Negative offset value is not allowed", val);
				SkipToEol(lp);
				return;
			}
			offset = val;
		} else --lp;		// there was second comma right after, reread it
		if (anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCTRD] Syntax error", bp, IF_FIRST);
				SkipToEol(lp);
				return;
			}
			if (val < 0) {
				ErrorInt("[INCTRD] Negative length value is not allowed", val);
				SkipToEol(lp);
				return;
			}
			length = val;
		}
	}
	if (TRD_PrepareIncFile(trdfile, filename.c_str(), offset, length)) {
		BinIncFile(trdfile, offset, length);
	}
}